

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O1

int proxy_start(proxy_handle *ph)

{
  long *plVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  plVar1 = (long *)ph->priv;
  if (0 < (int)plVar1[0x107]) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      iVar2 = proxy_conn_start((proxy_conn_handle *)(*plVar1 + lVar5));
      if (iVar2 < 0) {
        pcVar3 = strerror(-iVar2);
        proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start proxy connection #%d (%d): %s\n",
                  uVar6 & 0xffffffff,(ulong)(uint)-iVar2,pcVar3);
        goto LAB_00104f59;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x48;
    } while ((long)uVar6 < (long)(int)plVar1[0x107]);
  }
  uVar6 = 0;
  if (0 < (int)plVar1[0x107]) {
    lVar5 = 0x20;
    uVar6 = 0;
    do {
      iVar2 = worker_start((worker_handle *)(plVar1[0x103] + lVar5));
      if (iVar2 < 0) {
        pcVar3 = strerror(-iVar2);
        proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start proxy worker #%d (%d): %s\n",
                  uVar6 & 0xffffffff,(ulong)(uint)-iVar2,pcVar3);
        goto LAB_00104f1d;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x50;
    } while ((long)uVar6 < (long)(int)plVar1[0x107]);
  }
  mutex_lock((mutex_handle *)(plVar1 + 0x10e));
  *(int *)((long)plVar1 + 0x83c) = (int)plVar1[0x107];
  mutex_unlock((mutex_handle *)(plVar1 + 0x10e));
  proxy_update_registration(ph);
  iVar2 = registration_service_start((registration_service_handle *)(plVar1 + 0x111),&ph->conf);
  iVar4 = 0;
  if (iVar2 < 0) {
    pcVar3 = strerror(-iVar2);
    proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start registration service (%d): %s\n",
              (ulong)(uint)-iVar2,pcVar3);
LAB_00104f1d:
    if (0 < (int)uVar6) {
      lVar5 = (uVar6 & 0xffffffff) + 1;
      lVar7 = (uVar6 & 0xffffffff) * 0x50 + -0x30;
      do {
        worker_join((worker_handle *)(plVar1[0x103] + lVar7));
        lVar5 = lVar5 + -1;
        lVar7 = lVar7 + -0x50;
      } while (1 < lVar5);
    }
    uVar6 = (ulong)*(uint *)(plVar1 + 0x107);
LAB_00104f59:
    iVar4 = iVar2;
    if (0 < (int)uVar6) {
      lVar7 = (uVar6 & 0xffffffff) + 1;
      lVar5 = (uVar6 & 0xffffffff) * 0x48;
      do {
        lVar5 = lVar5 + -0x48;
        proxy_conn_stop((proxy_conn_handle *)(*plVar1 + lVar5));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
  }
  return iVar4;
}

Assistant:

int proxy_start(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int ret;
	int i;

	for (i = 0; i < priv->num_clients; i++) {
		ret = proxy_conn_start(&priv->clients[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to start proxy connection #%d (%d): %s\n",
				  i, -ret, strerror(-ret));
			goto proxy_start_exit_early;
		}
	}

	for (i = 0; i < priv->num_clients; i++) {
		ret = worker_start(&priv->client_workers[i].worker);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to start proxy worker #%d (%d): %s\n",
				  i, -ret, strerror(-ret));
			goto proxy_start_exit;
		}
	}

	mutex_lock(&priv->usable_clients_mutex);
	priv->usable_clients = priv->num_clients;
	mutex_unlock(&priv->usable_clients_mutex);

	proxy_update_registration(ph);
	ret = registration_service_start(&priv->reg_service, &ph->conf);
	if (ret < 0) {
		proxy_log(ph, LOG_LEVEL_FATAL,
			  "Failed to start registration service (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_start_exit;
	}

	return 0;

proxy_start_exit:
	for (i--; i >= 0; i--)
		worker_join(&priv->client_workers[i].worker);

	i = priv->num_clients;

proxy_start_exit_early:
	for (i--; i >= 0; i--)
		proxy_conn_stop(&priv->clients[i]);

	return ret;
}